

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  TargetType tgtType;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmMakefile *pcVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  cmMessenger *messenger;
  ostream *poVar6;
  cmGlobalGenerator *this_00;
  size_t sVar7;
  char *__s;
  ostringstream e;
  char *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_72_2_0a0279e7_for_Entry_0 local_198;
  ios_base local_138 [264];
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  tgtType = (_Var1._M_head_impl)->TargetType;
  local_1d0 = value;
  messenger = cmMakefile::GetMessenger((_Var1._M_head_impl)->Makefile);
  cmMakefile::GetBacktrace
            (((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if (!bVar3) {
    return;
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propCOMPILE_DEFINITIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propCOMPILE_FEATURES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus
    ._M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                      propCOMPILE_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCUDA_PTX_COMPILATION_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propCUDA_PTX_COMPILATION_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCUDA_PTX_COMPILATION_abi_cxx11_,"CUDA_PTX_COMPILATION","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCUDA_PTX_COMPILATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCUDA_PTX_COMPILATION_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propEXPORT_NAME_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                     propEXPORT_NAME_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
               "EXPORT_NAME","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propEXPORT_NAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propIMPORTED_GLOBAL_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_._M_dataplus
    ._M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                      propIMPORTED_GLOBAL_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_
               ,"IMPORTED_GLOBAL","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propIMPORTED_GLOBAL_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propINCLUDE_DIRECTORIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                     propLINK_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propLINK_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propLINK_DIRECTORIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propLINK_DIRECTORIES_abi_cxx11_,"LINK_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                     propLINK_LIBRARIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::
       propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
    ._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::
                   propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,"MANUALLY_ADDED_DEPENDENCIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propNAME_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
               "NAME","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propSOURCES_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
               "SOURCES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propSOURCES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propTYPE_abi_cxx11_), iVar5 != 0)) {
    SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
               "TYPE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_);
  }
  sVar7 = prop->_M_string_length;
  if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::
                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_._M_string_length) &&
     ((sVar7 == 0 ||
      (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                    SetProperty(std::__cxx11::string_const&,char_const*)::
                    propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0))
     )) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n",0x32);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
  }
  else if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_.
                     _M_string_length) &&
          ((sVar7 == 0 ||
           (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                         SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_.
                         _M_dataplus._M_p,sVar7), iVar5 == 0)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"NAME property is read-only\n",0x1b);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
  }
  else if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_.
                     _M_string_length) &&
          ((sVar7 == 0 ||
           (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                         SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_.
                         _M_dataplus._M_p,sVar7), iVar5 == 0)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"TYPE property is read-only\n",0x1b);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
  }
  else if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::
                     propEXPORT_NAME_abi_cxx11_._M_string_length) &&
          (((sVar7 == 0 ||
            (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                          SetProperty(std::__cxx11::string_const&,char_const*)::
                          propEXPORT_NAME_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0)) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
            true)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"EXPORT_NAME property can\'t be set on imported targets (\"",
               0x38);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                        *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
  }
  else if (((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_.
                      _M_string_length) &&
           ((sVar7 == 0 ||
            (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                          SetProperty(std::__cxx11::string_const&,char_const*)::
                          propSOURCES_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0)))) &&
          (((this->impl)._M_t.
            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
            super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
           true)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"SOURCES property can\'t be set on imported targets (\"",0x34);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                        *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
  }
  else {
    if (((sVar7 != SetProperty(std::__cxx11::string_const&,char_const*)::
                   propIMPORTED_GLOBAL_abi_cxx11_._M_string_length) ||
        ((sVar7 != 0 &&
         (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                       SetProperty(std::__cxx11::string_const&,char_const*)::
                       propIMPORTED_GLOBAL_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 != 0)))) ||
       (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget != false)
       ) {
      if ((sVar7 == SetProperty(std::__cxx11::string_const&,char_const*)::
                    propINCLUDE_DIRECTORIES_abi_cxx11_._M_string_length) &&
         ((sVar7 == 0 ||
          (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                        SetProperty(std::__cxx11::string_const&,char_const*)::
                        propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p,sVar7), iVar5 == 0)))) {
        _Var1._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&(_Var1._M_head_impl)->IncludeDirectoriesEntries,
                          *(pointer *)
                           &((_Var1._M_head_impl)->IncludeDirectoriesEntries).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         );
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                  (&((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    IncludeDirectoriesBacktraces);
        if (local_1d0 == (char *)0x0) {
          return;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    IncludeDirectoriesEntries,&local_1d0);
        cmMakefile::GetBacktrace
                  (((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                  (&((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    IncludeDirectoriesBacktraces,(value_type *)local_1a8);
      }
      else {
        _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_);
        if (_Var4) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileOptionsEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->CompileOptionsEntries).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           );
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                    (&((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileOptionsBacktraces);
          if (local_1d0 == (char *)0x0) {
            return;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileOptionsEntries,&local_1d0);
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                    (&((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileOptionsBacktraces,(value_type *)local_1a8);
        }
        else {
          _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                        propCOMPILE_FEATURES_abi_cxx11_);
          if (_Var4) {
            _Var1._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileFeaturesEntries,
                              *(pointer *)
                               &((_Var1._M_head_impl)->CompileFeaturesEntries).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             );
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                      (&((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        CompileFeaturesBacktraces);
            if (local_1d0 == (char *)0x0) {
              return;
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        CompileFeaturesEntries,&local_1d0);
            cmMakefile::GetBacktrace
                      (((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        CompileFeaturesBacktraces,(value_type *)local_1a8);
          }
          else {
            _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                          propCOMPILE_DEFINITIONS_abi_cxx11_);
            if (_Var4) {
              _Var1._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileDefinitionsEntries,
                                *(pointer *)
                                 &((_Var1._M_head_impl)->CompileDefinitionsEntries).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               );
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          CompileDefinitionsBacktraces);
              if (local_1d0 == (char *)0x0) {
                return;
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          CompileDefinitionsEntries,&local_1d0);
              cmMakefile::GetBacktrace
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          CompileDefinitionsBacktraces,(value_type *)local_1a8);
            }
            else {
              _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                            propLINK_OPTIONS_abi_cxx11_);
              if (_Var4) {
                _Var1._M_head_impl =
                     (this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkOptionsEntries,
                                  *(pointer *)
                                   &((_Var1._M_head_impl)->LinkOptionsEntries).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 );
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                          (&((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            LinkOptionsBacktraces);
                if (local_1d0 == (char *)0x0) {
                  return;
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            LinkOptionsEntries,&local_1d0);
                cmMakefile::GetBacktrace
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            LinkOptionsBacktraces,(value_type *)local_1a8);
              }
              else {
                _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                              propLINK_DIRECTORIES_abi_cxx11_);
                if (_Var4) {
                  _Var1._M_head_impl =
                       (this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkDirectoriesEntries,
                                    *(pointer *)
                                     &((_Var1._M_head_impl)->LinkDirectoriesEntries).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   );
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              LinkDirectoriesBacktraces);
                  if (local_1d0 == (char *)0x0) {
                    return;
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              LinkDirectoriesEntries,&local_1d0);
                  cmMakefile::GetBacktrace
                            (((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             Makefile);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              LinkDirectoriesBacktraces,(value_type *)local_1a8);
                }
                else {
                  _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)
                                                ::propLINK_LIBRARIES_abi_cxx11_);
                  if (_Var4) {
                    _Var1._M_head_impl =
                         (this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkImplementationPropertyEntries,
                                      *(pointer *)
                                       &((_Var1._M_head_impl)->LinkImplementationPropertyEntries).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     );
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                LinkImplementationPropertyBacktraces);
                    if (local_1d0 == (char *)0x0) {
                      return;
                    }
                    cmMakefile::GetBacktrace
                              (((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Makefile);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                LinkImplementationPropertyEntries,&local_1d0);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               LinkImplementationPropertyBacktraces,(value_type *)local_1a8);
                  }
                  else {
                    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propSOURCES_abi_cxx11_);
                    if (!_Var4) {
                      _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propIMPORTED_GLOBAL_abi_cxx11_);
                      if (_Var4) {
                        bVar3 = cmSystemTools::IsOn(local_1d0);
                        if (bVar3) {
                          _Var1._M_head_impl =
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                          if ((_Var1._M_head_impl)->ImportedGloballyVisible != false) {
                            return;
                          }
                          (_Var1._M_head_impl)->ImportedGloballyVisible = true;
                          this_00 = cmMakefile::GetGlobalGenerator((_Var1._M_head_impl)->Makefile);
                          cmGlobalGenerator::IndexTarget(this_00,this);
                          return;
                        }
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\"",
                                   0x3c);
                        _Var1._M_head_impl =
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_1a8,
                                            ((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                                            *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
                        pcVar2 = ((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
                      }
                      else {
                        iVar5 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LIBNAME",0x10);
                        if (iVar5 == 0) {
                          _Var1._M_head_impl =
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                          __s = "";
                          if (local_1d0 != (char *)0x0) {
                            __s = local_1d0;
                          }
                          local_1a8._0_8_ = &local_198;
                          sVar7 = strlen(__s);
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1a8,__s,__s + sVar7);
                          bVar3 = cmTargetInternals::CheckImportedLibName
                                            (_Var1._M_head_impl,prop,(string *)local_1a8);
                          if ((anon_union_72_2_0a0279e7_for_Entry_0 *)local_1a8._0_8_ != &local_198)
                          {
                            operator_delete((void *)local_1a8._0_8_,
                                            (ulong)&((local_198.Bottom.State)->PropertyDefinitions).
                                                    _M_t._M_impl.field_0x1);
                          }
                          if (!bVar3) {
                            return;
                          }
                        }
                        _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propCUDA_PTX_COMPILATION_abi_cxx11_);
                        _Var1._M_head_impl =
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                        if ((!_Var4) || ((_Var1._M_head_impl)->TargetType == 4)) {
                          cmPropertyMap::SetProperty
                                    (&(_Var1._M_head_impl)->Properties,prop,local_1d0);
                          return;
                        }
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,
                                   "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                   ,0x46);
                        _Var1._M_head_impl =
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_1a8,
                                            ((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                                            *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
                        pcVar2 = ((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
                      }
                      goto LAB_0017d03e;
                    }
                    _Var1._M_head_impl =
                         (this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_M_erase_at_end(&(_Var1._M_head_impl)->SourceEntries,
                                      *(pointer *)
                                       &((_Var1._M_head_impl)->SourceEntries).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     );
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                SourceBacktraces);
                    if (local_1d0 == (char *)0x0) {
                      return;
                    }
                    cmMakefile::GetBacktrace
                              (((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Makefile);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                SourceEntries,&local_1d0);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               SourceBacktraces,(value_type *)local_1a8);
                  }
                }
              }
            }
          }
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\"",0x40);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                        *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c8);
  }
LAB_0017d03e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, impl->Makefile->GetMessenger(),
        impl->Makefile->GetBacktrace())) {
    return;
  }
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(CUDA_PTX_COMPILATION);
  MAKE_STATIC_PROP(EXPORT_NAME);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
  MAKE_STATIC_PROP(TYPE);
#undef MAKE_STATIC_PROP
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propNAME) {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propTYPE) {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << impl->Name
      << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    impl->IncludeDirectoriesEntries.clear();
    impl->IncludeDirectoriesBacktraces.clear();
    if (value) {
      impl->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    impl->CompileOptionsEntries.clear();
    impl->CompileOptionsBacktraces.clear();
    if (value) {
      impl->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    impl->CompileFeaturesEntries.clear();
    impl->CompileFeaturesBacktraces.clear();
    if (value) {
      impl->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    impl->CompileDefinitionsEntries.clear();
    impl->CompileDefinitionsBacktraces.clear();
    if (value) {
      impl->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    impl->LinkOptionsEntries.clear();
    impl->LinkOptionsBacktraces.clear();
    if (value) {
      impl->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    impl->LinkDirectoriesEntries.clear();
    impl->LinkDirectoriesBacktraces.clear();
    if (value) {
      impl->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    impl->LinkImplementationPropertyEntries.clear();
    impl->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkImplementationPropertyEntries.emplace_back(value);
      impl->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == propSOURCES) {
    impl->SourceEntries.clear();
    impl->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->SourceEntries.emplace_back(value);
      impl->SourceBacktraces.push_back(lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmSystemTools::IsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << impl->Name << "\")\n";
      impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!impl->ImportedGloballyVisible) {
      impl->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !impl->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else {
    impl->Properties.SetProperty(prop, value);
  }
}